

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::SubSurfaceMaterial::writeTo(SubSurfaceMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *__buf;
  BinaryWriter *in_RSI;
  BinaryWriter *in_RDI;
  
  Material::writeTo((Material *)in_RSI,in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<float>(in_RSI,(float *)in_RDI);
  BinaryWriter::write<bool>(in_RSI,(bool *)in_RDI);
  BinaryWriter::write(in_RSI,(int)in_RDI + 0x48,__buf,in_RCX);
  return 0x12;
}

Assistant:

int SubSurfaceMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(uRoughness);
    binary.write(vRoughness);
    binary.write(remapRoughness);
    binary.write(name);
    return TYPE_SUBSURFACE_MATERIAL;
  }